

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<bool>::Clear
          (RepeatedFieldWrapper<bool> *this,Field *data)

{
  RepeatedField<bool> *this_00;
  Field *data_local;
  RepeatedFieldWrapper<bool> *this_local;
  
  this_00 = (RepeatedField<bool> *)(**(code **)(*(long *)this + 0x88))(this,data);
  RepeatedField<bool>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }